

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O3

void __thiscall
duckdb::TopNHeap::AddLargeHeap(TopNHeap *this,DataChunk *input,Vector *sort_keys_vec)

{
  string_t *right;
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  pointer pTVar6;
  anon_struct_16_3_d7536bce_for_pointer *right_00;
  iterator __position;
  ulong uVar7;
  vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *this_00;
  ulong uVar8;
  idx_t sel_count;
  ulong uVar9;
  anon_union_16_2_67f50693_for_value local_a8;
  idx_t local_98;
  DataChunk *local_88;
  TopNHeap *local_80;
  DataChunk *local_78;
  StringHeap *local_70;
  vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *local_68;
  idx_t local_60;
  data_ptr_t local_58;
  idx_t local_50;
  anon_union_16_2_67f50693_for_value local_48;
  idx_t local_38;
  
  if (input->count != 0) {
    local_58 = sort_keys_vec->data;
    local_78 = &this->heap_data;
    local_60 = (this->heap_data).count;
    this_00 = (vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *)&this->heap;
    local_70 = &this->sort_key_heap;
    sel_count = 0;
    uVar8 = 0;
    local_88 = input;
    local_80 = this;
    local_68 = this_00;
    do {
      right_00 = (anon_struct_16_3_d7536bce_for_pointer *)(local_58 + uVar8 * 0x10);
      pTVar6 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
               super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((ulong)(((long)(this->heap).
                          super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                          super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pTVar6 >> 3) *
                  -0x5555555555555555) < this->heap_size) ||
         (bVar5 = string_t::StringComparisonOperators::GreaterThan
                            (&pTVar6->sort_key,(string_t *)right_00), bVar5)) {
        if (right_00->length < 0xd) {
          local_48.pointer = *right_00;
        }
        else {
          local_48.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringHeap::AddBlob(local_70,(string_t *)right_00);
        }
        local_38 = local_60 + sel_count;
        pTVar6 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __position._M_current =
             (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
             super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (this->heap_size <=
            (ulong)(((long)__position._M_current - (long)pTVar6 >> 3) * -0x5555555555555555)) {
          if (0x18 < (long)__position._M_current - (long)pTVar6) {
            local_98 = __position._M_current[-1].index;
            local_a8._0_8_ = *(undefined8 *)&__position._M_current[-1].sort_key.value;
            local_a8.pointer.ptr = __position._M_current[-1].sort_key.value.pointer.ptr;
            pcVar4 = *(char **)((long)&(pTVar6->sort_key).value + 8);
            *(undefined8 *)&__position._M_current[-1].sort_key.value =
                 *(undefined8 *)&(pTVar6->sort_key).value;
            __position._M_current[-1].sort_key.value.pointer.ptr = pcVar4;
            __position._M_current[-1].index = pTVar6->index;
            ::std::
            __adjust_heap<__gnu_cxx::__normal_iterator<duckdb::TopNEntry*,std::vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>>>,long,duckdb::TopNEntry,__gnu_cxx::__ops::_Iter_less_iter>
                      (pTVar6,0,((long)__position._M_current + (-0x18 - (long)pTVar6) >> 3) *
                                -0x5555555555555555);
            __position._M_current =
                 (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          }
          __position._M_current = __position._M_current + -1;
          (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
          super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current;
        }
        local_50 = sel_count;
        if (__position._M_current ==
            (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
            super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>>::
          _M_realloc_insert<duckdb::TopNEntry_const&>
                    (this_00,__position,(TopNEntry *)&local_48.pointer);
          pTVar6 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                   super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        }
        else {
          (__position._M_current)->index = local_38;
          *(undefined8 *)&((__position._M_current)->sort_key).value = local_48._0_8_;
          ((__position._M_current)->sort_key).value.pointer.ptr = local_48.pointer.ptr;
          pTVar6 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                   super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
          (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
          super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
          super__Vector_impl_data._M_finish = pTVar6;
        }
        lVar3 = *(long *)this_00;
        local_98 = pTVar6[-1].index;
        local_a8._0_8_ = *(undefined8 *)&pTVar6[-1].sort_key.value;
        local_a8.pointer.ptr = pTVar6[-1].sort_key.value.pointer.ptr;
        uVar7 = ((long)pTVar6 - lVar3 >> 3) * -0x5555555555555555 - 1;
        if (0x18 < (long)pTVar6 - lVar3) {
          do {
            uVar2 = uVar7 - 1;
            uVar9 = uVar2 >> 1;
            right = (string_t *)(lVar3 + uVar9 * 0x18);
            bVar5 = string_t::StringComparisonOperators::GreaterThan
                              ((string_t *)&local_a8.pointer,right);
            this = local_80;
            input = local_88;
            if (!bVar5) goto LAB_00bdd1a8;
            *(undefined8 *)(lVar3 + 0x10 + uVar7 * 0x18) = *(undefined8 *)&right[1].value;
            pcVar4 = (right->value).pointer.ptr;
            puVar1 = (undefined8 *)(lVar3 + uVar7 * 0x18);
            *puVar1 = *(undefined8 *)&right->value;
            puVar1[1] = pcVar4;
            uVar7 = uVar9;
          } while (1 < uVar2);
          uVar7 = 0;
        }
LAB_00bdd1a8:
        *(idx_t *)(lVar3 + 0x10 + uVar7 * 0x18) = local_98;
        puVar1 = (undefined8 *)(lVar3 + uVar7 * 0x18);
        *puVar1 = local_a8._0_8_;
        puVar1[1] = local_a8.pointer.ptr;
        (this->matching_sel).sel_vector[local_50] = (sel_t)uVar8;
        sel_count = local_50 + 1;
        this_00 = local_68;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < input->count);
    if (sel_count != 0) {
      DataChunk::Append(local_78,input,true,&this->matching_sel,sel_count);
    }
  }
  return;
}

Assistant:

void TopNHeap::AddLargeHeap(DataChunk &input, Vector &sort_keys_vec) {
	auto sort_key_values = FlatVector::GetData<string_t>(sort_keys_vec);
	idx_t base_index = heap_data.size();
	idx_t match_count = 0;
	for (idx_t r = 0; r < input.size(); r++) {
		auto &sort_key = sort_key_values[r];
		if (!EntryShouldBeAdded(sort_key)) {
			continue;
		}
		// replace the previous top entry with the new entry
		TopNEntry entry;
		entry.sort_key = sort_key.IsInlined() ? sort_key : sort_key_heap.AddBlob(sort_key);
		entry.index = base_index + match_count;
		AddEntryToHeap(entry);
		matching_sel.set_index(match_count++, r);
	}
	if (match_count == 0) {
		// early-out: no matches
		return;
	}

	// copy over the input rows to the payload chunk
	heap_data.Append(input, true, &matching_sel, match_count);
}